

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

string * __thiscall
flatbuffers::PosixPath_abi_cxx11_(string *__return_storage_ptr__,flatbuffers *this,char *path)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,(char *)this,&local_9);
  sVar1 = __return_storage_ptr__->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '\\') {
        pcVar2[sVar3] = '/';
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PosixPath(const char *path) {
  std::string p = path;
  std::replace(p.begin(), p.end(), '\\', '/');
  return p;
}